

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animstate.cpp
# Opt level: O3

void AnimSeqEval(CAnimSequence *pSeq,float Time,CAnimKeyframe *pFrame)

{
  undefined8 uVar1;
  uint uVar2;
  CAnimKeyframe *pCVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  uVar2 = pSeq->m_NumFrames;
  if ((ulong)uVar2 == 0) {
    fVar5 = 0.0;
    fVar6 = 0.0;
    fVar8 = 0.0;
    fVar7 = 0.0;
  }
  else {
    if (uVar2 != 1) {
      if (1 < (int)uVar2) {
        pCVar3 = pSeq->m_aFrames;
        lVar4 = 0x10;
        do {
          fVar5 = *(float *)((long)&pCVar3[-1].m_Time + lVar4);
          if ((fVar5 <= Time) && (fVar6 = *(float *)((long)&pCVar3->m_Time + lVar4), Time <= fVar6))
          {
            fVar8 = (Time - fVar5) / (fVar6 - fVar5);
            pFrame->m_Time = Time;
            uVar1 = *(undefined8 *)((long)pCVar3 + lVar4 + -0xc);
            fVar5 = (float)uVar1;
            fVar6 = (float)((ulong)uVar1 >> 0x20);
            uVar1 = *(undefined8 *)((long)&pCVar3->m_X + lVar4);
            pFrame->m_X = fVar8 * ((float)uVar1 - fVar5) + fVar5;
            pFrame->m_Y = fVar8 * ((float)((ulong)uVar1 >> 0x20) - fVar6) + fVar6;
            fVar5 = *(float *)((long)pCVar3 + lVar4 + -4);
            pFrame->m_Angle = (*(float *)((long)&pCVar3->m_Angle + lVar4) - fVar5) * fVar8 + fVar5;
            return;
          }
          lVar4 = lVar4 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar4);
      }
      return;
    }
    pCVar3 = pSeq->m_aFrames;
    fVar5 = pCVar3->m_Time;
    fVar6 = pCVar3->m_X;
    fVar8 = pCVar3->m_Y;
    fVar7 = pCVar3->m_Angle;
  }
  pFrame->m_Time = fVar5;
  pFrame->m_X = fVar6;
  pFrame->m_Y = fVar8;
  pFrame->m_Angle = fVar7;
  return;
}

Assistant:

static void AnimSeqEval(CAnimSequence *pSeq, float Time, CAnimKeyframe *pFrame)
{
	if(pSeq->m_NumFrames == 0)
	{
		pFrame->m_Time = 0;
		pFrame->m_X = 0;
		pFrame->m_Y = 0;
		pFrame->m_Angle = 0;
	}
	else if(pSeq->m_NumFrames == 1)
	{
		*pFrame = pSeq->m_aFrames[0];
	}
	else
	{
		//time = maximum(0.0f, minimum(1.0f, time / duration)); // TODO: use clamp
		CAnimKeyframe *pFrame1 = 0;
		CAnimKeyframe *pFrame2 = 0;
		float Blend = 0.0f;

		// TODO: make this smarter.. binary search
		for (int i = 1; i < pSeq->m_NumFrames; i++)
		{
			if (pSeq->m_aFrames[i-1].m_Time <= Time && pSeq->m_aFrames[i].m_Time >= Time)
			{
				pFrame1 = &pSeq->m_aFrames[i-1];
				pFrame2 = &pSeq->m_aFrames[i];
				Blend = (Time - pFrame1->m_Time) / (pFrame2->m_Time - pFrame1->m_Time);
				break;
			}
		}

		if (pFrame1 && pFrame2)
		{
			pFrame->m_Time = Time;
			pFrame->m_X = mix(pFrame1->m_X, pFrame2->m_X, Blend);
			pFrame->m_Y = mix(pFrame1->m_Y, pFrame2->m_Y, Blend);
			pFrame->m_Angle = mix(pFrame1->m_Angle, pFrame2->m_Angle, Blend);
		}
	}
}